

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AttributeRecordSet.cpp
# Opt level: O3

void __thiscall
KDIS::DATA_TYPE::AttributeRecordSet::Encode(AttributeRecordSet *this,KDataStream *stream)

{
  pointer pKVar1;
  pointer pKVar2;
  
  (*(this->m_EntityID).super_SimulationIdentifier.super_DataTypeBase._vptr_DataTypeBase[5])
            (&this->m_EntityID);
  KDataStream::Write<unsigned_short>(stream,this->m_ui16NumAttrRecs);
  pKVar1 = (this->m_vAttrRec).
           super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pKVar2 = (this->m_vAttrRec).
                super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pKVar2 != pKVar1; pKVar2 = pKVar2 + 1) {
    (*(pKVar2->m_pRef->super_DataTypeBase)._vptr_DataTypeBase[5])(pKVar2->m_pRef,stream);
  }
  return;
}

Assistant:

void AttributeRecordSet::Encode( KDataStream & stream ) const
{
    stream << KDIS_STREAM m_EntityID
           << m_ui16NumAttrRecs;

    vector<StdVarPtr>::const_iterator citr = m_vAttrRec.begin();
    vector<StdVarPtr>::const_iterator citrEnd = m_vAttrRec.end();
    for( ; citr != citrEnd; ++citr )
    {
        ( *citr )->Encode( stream );
    }
}